

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

int IoCommandWriteTruths(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  Vec_Int_t *pVVar4;
  word *pTruth;
  char *pcVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar1 = false;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"rbh"), iVar3 == 0x62) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar3 == -1) break;
    if (iVar3 != 0x72) goto LAB_00327bfb;
    bVar2 = (bool)(bVar2 ^ 1);
  }
  pGVar6 = pAbc->pGia;
  if (pGVar6 == (Gia_Man_t *)0x0) {
    Abc_Print(-1,"IoCommandWriteTruths(): There is no AIG.\n");
    return 1;
  }
  iVar3 = pGVar6->vCis->nSize - pGVar6->nRegs;
  if (iVar3 < 0x11) {
    if (2 < iVar3) {
      if (globalUtilOptind + 1 == argc) {
        pcVar5 = argv[globalUtilOptind];
        __stream = fopen(pcVar5,"wb");
        if (__stream == (FILE *)0x0) {
          printf("Cannot open file \"%s\" for writing.\n",pcVar5);
          return 0;
        }
        pGVar6 = pAbc->pGia;
        pVVar4 = pGVar6->vCos;
        if (pVVar4->nSize < 1) goto LAB_00327bec;
        iVar3 = pAbc->pGia->vCis->nSize - pAbc->pGia->nRegs;
        iVar7 = 8 << ((char)iVar3 - 6U & 0x1f);
        if (iVar3 < 7) {
          iVar7 = 8;
        }
        lVar8 = 0;
        goto LAB_00327b5e;
      }
LAB_00327bfb:
      fwrite("usage: &write_truths [-rbh] <file>\n",0x23,1,(FILE *)pAbc->Err);
      fwrite("\t         writes truth tables of each PO of GIA manager into a file\n",0x44,1,
             (FILE *)pAbc->Err);
      pcVar9 = "yes";
      pcVar5 = "yes";
      if (!bVar2) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-r     : toggle reversing bits in the truth table [default = %s]\n",pcVar5);
      if (!bVar1) {
        pcVar9 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-b     : toggle using binary format [default = %s]\n",pcVar9);
      fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
      fwrite("\tfile   : the name of the file to write\n",0x28,1,(FILE *)pAbc->Err);
      return 1;
    }
    pcVar5 = "IoCommandWriteTruths(): Can write truth tables for 3 inputs or more.\n";
  }
  else {
    pcVar5 = "IoCommandWriteTruths(): Can write truth tables up to 16 inputs.\n";
  }
  Abc_Print(-1,pcVar5);
  return 0;
  while( true ) {
    pTruth = Gia_ObjComputeTruthTable(pGVar6,pGVar6->pObjs + iVar3);
    if (bVar1) {
      fwrite(pTruth,(long)iVar7,1,__stream);
    }
    else {
      Extra_PrintHex((FILE *)__stream,(uint *)pTruth,pAbc->pGia->vCis->nSize - pAbc->pGia->nRegs);
      fputc(10,__stream);
    }
    lVar8 = lVar8 + 1;
    pGVar6 = pAbc->pGia;
    pVVar4 = pGVar6->vCos;
    if (pVVar4->nSize <= lVar8) break;
LAB_00327b5e:
    iVar3 = pVVar4->pArray[lVar8];
    if (((long)iVar3 < 0) || (pGVar6->nObjs <= iVar3)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
  }
LAB_00327bec:
  fclose(__stream);
  return 0;
}

Assistant:

int IoCommandWriteTruths( Abc_Frame_t * pAbc, int argc, char **argv )
{
    Gia_Obj_t * pObj;
    char * pFileName;
    FILE * pFile;
    word * pTruth;
    int nBytes;
    int fReverse = 0;
    int fBinary = 0;
    int c, i;
 
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rbh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'r':
                fReverse ^= 1;
                break;
            case 'b':
                fBinary ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "IoCommandWriteTruths(): There is no AIG.\n" );
        return 1;
    } 
    if ( Gia_ManPiNum(pAbc->pGia) > 16 )
    {
        Abc_Print( -1, "IoCommandWriteTruths(): Can write truth tables up to 16 inputs.\n" );
        return 0;
    }
    if ( Gia_ManPiNum(pAbc->pGia) < 3 )
    {
        Abc_Print( -1, "IoCommandWriteTruths(): Can write truth tables for 3 inputs or more.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // convert to logic
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return 0;
    }
    nBytes = 8 * Abc_Truth6WordNum( Gia_ManPiNum(pAbc->pGia) );
    Gia_ManForEachCo( pAbc->pGia, pObj, i )
    {
        pTruth = Gia_ObjComputeTruthTable( pAbc->pGia, pObj );
        if ( fBinary )
            fwrite( pTruth, nBytes, 1, pFile );
        else
            Extra_PrintHex( pFile, (unsigned *)pTruth, Gia_ManPiNum(pAbc->pGia) ), fprintf( pFile, "\n" );
    }
    fclose( pFile );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: &write_truths [-rbh] <file>\n" );
    fprintf( pAbc->Err, "\t         writes truth tables of each PO of GIA manager into a file\n" );
    fprintf( pAbc->Err, "\t-r     : toggle reversing bits in the truth table [default = %s]\n", fReverse? "yes":"no" );
    fprintf( pAbc->Err, "\t-b     : toggle using binary format [default = %s]\n", fBinary? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}